

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall
cmComputeLinkDepends::FollowSharedDeps
          (cmComputeLinkDepends *this,int depender_index,cmLinkInterface *iface,
          bool follow_interface)

{
  pair<std::_Rb_tree_iterator<int>,_bool> pVar1;
  int local_1c;
  
  local_1c = depender_index;
  pVar1 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->SharedDepFollowed,&local_1c);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (follow_interface) {
      QueueSharedDependencies
                (this,local_1c,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
    }
    QueueSharedDependencies(this,local_1c,&iface->SharedDeps);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::FollowSharedDeps(int depender_index,
                                            cmLinkInterface const* iface,
                                            bool follow_interface)
{
  // Follow dependencies if we have not followed them already.
  if (this->SharedDepFollowed.insert(depender_index).second) {
    if (follow_interface) {
      this->QueueSharedDependencies(depender_index, iface->Libraries);
    }
    this->QueueSharedDependencies(depender_index, iface->SharedDeps);
  }
}